

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall
Assimp::HMPImporter::CreateMaterial(HMPImporter *this,uchar *szCurrent,uchar **szCurrentOut)

{
  int iVar1;
  uchar *puVar2;
  aiMesh *paVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  aiVector3D *__s;
  aiMaterial *this_00;
  aiMaterial **ppaVar6;
  ulong uVar7;
  int iMode;
  uchar *local_458;
  uchar **local_450;
  uchar *szCurrent_local;
  aiColor3D local_440;
  aiString szName;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  szCurrent_local = szCurrent;
  local_450 = szCurrentOut;
  local_458 = szCurrent;
  if (*(int *)(puVar2 + 0x30) == 0) {
    iMode = 2;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    aiMaterial::AddProperty<int>(this_00,&iMode,1,"$mat.shadingm",0,0);
    local_440.r = 0.6;
    local_440.g = 0.6;
    local_440.b = 0.6;
    aiMaterial::AddProperty<aiColor3D>(this_00,&local_440,1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty<aiColor3D>(this_00,&local_440,1,"$clr.specular",0,0);
    local_440.r = 0.05;
    local_440.g = 0.05;
    local_440.b = 0.05;
    aiMaterial::AddProperty<aiColor3D>(this_00,&local_440,1,"$clr.ambient",0,0);
    szName.length = 0;
    szName.data[0] = '\0';
    memset(szName.data + 1,0x1b,0x3ff);
    aiString::Set(&szName,"DefaultMaterial");
    aiMaterial::AddProperty(this_00,&szName,"?mat.name",0,0);
    ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
    ppaVar6 = (aiMaterial **)operator_new__(8);
    ((this->super_MDLImporter).pScene)->mMaterials = ppaVar6;
    *((this->super_MDLImporter).pScene)->mMaterials = this_00;
    szCurrent_local = local_458;
  }
  else {
    paVar3 = *((this->super_MDLImporter).pScene)->mMeshes;
    iVar1 = *(int *)(puVar2 + 0x3c);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar1;
    uVar5 = SUB168(auVar4 * ZEXT816(0xc),0);
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
      uVar7 = uVar5;
    }
    __s = (aiVector3D *)operator_new__(uVar7);
    if (iVar1 != 0) {
      uVar5 = uVar5 - 0xc;
      memset(__s,0,(uVar5 - uVar5 % 0xc) + 0xc);
    }
    paVar3->mTextureCoords[0] = __s;
    paVar3->mNumUVComponents[0] = 2;
    ReadFirstSkin(this,*(uint *)(puVar2 + 0x30),local_458,&szCurrent_local);
  }
  *local_450 = szCurrent_local;
  return;
}

Assistant:

void HMPImporter::CreateMaterial(const unsigned char* szCurrent,
    const unsigned char** szCurrentOut)
{
    aiMesh* const pcMesh = pScene->mMeshes[0];
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    // we don't need to generate texture coordinates if
    // we have no textures in the file ...
    if (pcHeader->numskins)
    {
        pcMesh->mTextureCoords[0] = new aiVector3D[pcHeader->numverts];
        pcMesh->mNumUVComponents[0] = 2;

        // now read the first skin and skip all others
        ReadFirstSkin(pcHeader->numskins,szCurrent,&szCurrent);
    }
    else
    {
        // generate a default material
        const int iMode = (int)aiShadingMode_Gouraud;
        aiMaterial* pcHelper = new aiMaterial();
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        // add the material to the scene
        pScene->mNumMaterials = 1;
        pScene->mMaterials = new aiMaterial*[1];
        pScene->mMaterials[0] = pcHelper;
    }
    *szCurrentOut = szCurrent;
}